

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_generate_mlsag
              (secp256k1_context *ctx,uint8_t *ki,uint8_t *pc,uint8_t *ps,uint8_t *nonce,
              uint8_t *preimage,size_t nCols,size_t nRows,size_t index,uint8_t **sk,uint8_t *pk)

{
  secp256k1_context *psVar1;
  uint8_t *puVar2;
  undefined4 extraout_EAX;
  int iVar3;
  undefined4 extraout_EAX_00;
  long lVar4;
  secp256k1_fe *rzr;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t len;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  ulong uVar5;
  size_t extraout_RDX_03;
  size_t len_00;
  ulong extraout_RDX_04;
  size_t extraout_RDX_05;
  secp256k1_scalar *psVar6;
  size_t sVar7;
  secp256k1_sha256 *psVar8;
  undefined8 *puVar9;
  long lVar10;
  uchar *pub;
  byte bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  secp256k1_scalar clast;
  secp256k1_ge ge1;
  secp256k1_scalar ss;
  secp256k1_gej gej1;
  uint8_t tmp [64];
  secp256k1_scalar s;
  secp256k1_gej L;
  secp256k1_gej gej2;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_pubkey pubkey;
  secp256k1_sha256 sha256_pre;
  secp256k1_fe zr [8];
  secp256k1_gej R;
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  secp256k1_strauss_point_state ps_1 [1];
  secp256k1_scalar alpha [33];
  int local_1554;
  size_t local_1550;
  secp256k1_context *local_1548;
  long local_1540;
  uint8_t *local_1538;
  ulong local_1530;
  long local_1528;
  secp256k1_strauss_state local_1520;
  uint8_t *local_1500;
  size_t local_14f8;
  uint8_t *local_14f0;
  secp256k1_scalar local_14e8;
  secp256k1_ge local_14c8;
  secp256k1_scalar local_1470;
  long local_1450;
  secp256k1_gej local_1448;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  secp256k1_scalar local_1388;
  secp256k1_scalar local_1368;
  secp256k1_gej local_1348;
  secp256k1_sha256 local_12c8;
  undefined1 local_1258 [104];
  undefined1 local_11f0 [16];
  int local_11e0;
  secp256k1_rfc6979_hmac_sha256 local_11d4;
  secp256k1_pubkey local_1190;
  undefined8 local_1150 [13];
  secp256k1_fe local_10e8 [8];
  secp256k1_gej local_fa8;
  secp256k1_ge local_f28 [8];
  secp256k1_gej local_c68 [8];
  secp256k1_strauss_point_state local_868;
  secp256k1_scalar local_458 [33];
  
  bVar11 = 0;
  if ((nRows < 0x22) && (local_14f8 = nCols, nCols != 0)) {
    if (nRows < 2) {
      return 1;
    }
    if (pk == (uint8_t *)0x0) {
      return 1;
    }
    local_1528 = nRows - 1;
    local_1388.d[2] = 0;
    local_1388.d[3] = 0;
    local_1388.d[0] = 0;
    local_1388.d[1] = 0;
    local_13c8 = *(undefined8 *)nonce;
    uStack_13c0 = *(undefined8 *)(nonce + 8);
    local_13b8 = *(undefined8 *)(nonce + 0x10);
    uStack_13b0 = *(undefined8 *)(nonce + 0x18);
    local_13a8 = *(undefined8 *)preimage;
    uStack_13a0 = *(undefined8 *)(preimage + 8);
    local_1398 = *(undefined8 *)(preimage + 0x10);
    uStack_1390 = *(undefined8 *)(preimage + 0x18);
    local_1548 = ctx;
    local_1538 = ps;
    local_1500 = pc;
    local_14f0 = ki;
    secp256k1_rfc6979_hmac_sha256_initialize(&local_11d4,(uchar *)&local_13c8,0x40);
    local_12c8.s[0] = 0x6a09e667;
    local_12c8.s[1] = 0xbb67ae85;
    local_12c8.s[2] = 0x3c6ef372;
    local_12c8.s[3] = 0xa54ff53a;
    local_12c8.s[4] = 0x510e527f;
    local_12c8.s[5] = 0x9b05688c;
    local_12c8.s[6] = 0x1f83d9ab;
    local_12c8.s[7] = 0x5be0cd19;
    local_12c8.bytes = 0;
    secp256k1_sha256_write(&local_12c8,preimage,0x20);
    psVar8 = &local_12c8;
    puVar9 = local_1150;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar9 = *(undefined8 *)psVar8->s;
      psVar8 = (secp256k1_sha256 *)((long)psVar8 + (ulong)bVar11 * -0x10 + 8);
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    }
    lVar4 = 0;
    sVar7 = extraout_RDX;
    do {
      local_1530 = lVar4 * 0x20;
      psVar6 = local_458 + lVar4;
      local_1540 = lVar4;
      do {
        do {
          secp256k1_rfc6979_hmac_sha256_generate(&local_11d4,(uchar *)&local_13c8,sVar7);
          secp256k1_scalar_set_b32(psVar6,(uchar *)&local_13c8,&local_1554);
          psVar1 = local_1548;
          sVar7 = extraout_RDX_00;
        } while (local_1554 != 0);
        auVar12._0_4_ = -(uint)((int)psVar6->d[0] == 0 && (int)local_458[lVar4].d[2] == 0);
        auVar12._4_4_ =
             -(uint)(*(int *)((long)local_458[lVar4].d + 4) == 0 &&
                    *(int *)((long)local_458[lVar4].d + 0x14) == 0);
        auVar12._8_4_ = -(uint)((int)local_458[lVar4].d[1] == 0 && (int)local_458[lVar4].d[3] == 0);
        auVar12._12_4_ =
             -(uint)(*(int *)((long)local_458[lVar4].d + 0xc) == 0 &&
                    *(int *)((long)local_458[lVar4].d + 0x1c) == 0);
        iVar3 = movmskps(extraout_EAX,auVar12);
      } while (iVar3 == 0xf);
      iVar3 = secp256k1_ec_pubkey_create(local_1548,&local_1190,(uchar *)&local_13c8);
      if (iVar3 == 0) {
        return 1;
      }
      local_1550 = 0x21;
      iVar3 = secp256k1_ec_pubkey_serialize
                        (psVar1,(uchar *)&local_13c8,&local_1550,&local_1190,0x102);
      if (iVar3 == 0) {
        return 1;
      }
      if (local_1550 != 0x21) {
        return 1;
      }
      lVar4 = local_1540 * nCols;
      secp256k1_sha256_write(&local_12c8,pk + (lVar4 + index) * 0x21,0x21);
      secp256k1_sha256_write(&local_12c8,(uchar *)&local_13c8,0x21);
      iVar3 = hash_to_curve(&local_14c8,pk + (lVar4 + index) * 0x21,len);
      if (iVar3 != 0) {
        return 1;
      }
      local_1448.infinity = local_14c8.infinity;
      local_1448.x.n[4] = local_14c8.x.n[4];
      local_1448.x.n[2] = local_14c8.x.n[2];
      local_1448.x.n[3] = local_14c8.x.n[3];
      local_1448.x.n[0] = local_14c8.x.n[0];
      local_1448.x.n[1] = local_14c8.x.n[1];
      local_1448.y.n[4] = local_14c8.y.n[4];
      local_1448.y.n[2] = local_14c8.y.n[2];
      local_1448.y.n[3] = local_14c8.y.n[3];
      local_1448.y.n[0] = local_14c8.y.n[0];
      local_1448.y.n[1] = local_14c8.y.n[1];
      local_1448.z.n[0] = 1;
      local_1448.z.n[3] = 0;
      local_1448.z.n[4] = 0;
      local_1448.z.n[1] = 0;
      local_1448.z.n[2] = 0;
      local_1348.x.n[0] = (uint64_t)local_c68;
      local_1348.x.n[1] = (uint64_t)local_10e8;
      local_1348.x.n[2] = (uint64_t)local_f28;
      local_1348.x.n[3] = (uint64_t)&local_868;
      secp256k1_ecmult_strauss_wnaf
                (&local_1548->ecmult_ctx,(secp256k1_strauss_state *)&local_1348,
                 (secp256k1_gej *)local_1258,1,&local_1448,psVar6,&local_1388);
      secp256k1_ge_set_gej(&local_14c8,(secp256k1_gej *)local_1258);
      secp256k1_eckey_pubkey_serialize(&local_14c8,(uchar *)&local_13c8,&local_1550,1);
      secp256k1_sha256_write(&local_12c8,(uchar *)&local_13c8,0x21);
      secp256k1_scalar_set_b32(&local_1368,sk[local_1540],&local_1554);
      if (local_1554 != 0) {
        return 1;
      }
      if ((local_1368.d[3] == 0 && local_1368.d[1] == 0) &&
          (local_1368.d[2] == 0 && local_1368.d[0] == 0)) {
        return 1;
      }
      local_1348.x.n[0] = (uint64_t)local_c68;
      local_1348.x.n[1] = (uint64_t)local_10e8;
      local_1348.x.n[2] = (uint64_t)local_f28;
      local_1348.x.n[3] = (uint64_t)&local_868;
      secp256k1_ecmult_strauss_wnaf
                (&local_1548->ecmult_ctx,(secp256k1_strauss_state *)&local_1348,
                 (secp256k1_gej *)local_1258,1,&local_1448,&local_1368,&local_1388);
      secp256k1_ge_set_gej(&local_14c8,(secp256k1_gej *)local_1258);
      lVar4 = local_1540;
      secp256k1_eckey_pubkey_serialize
                (&local_14c8,local_14f0 + local_1530 + local_1540,&local_1550,1);
      lVar10 = local_1528;
      lVar4 = lVar4 + 1;
      sVar7 = extraout_RDX_01;
    } while (lVar4 != local_1528);
    psVar6 = local_458 + local_1528;
    do {
      do {
        secp256k1_rfc6979_hmac_sha256_generate(&local_11d4,(uchar *)&local_13c8,sVar7);
        secp256k1_scalar_set_b32(psVar6,(uchar *)&local_13c8,&local_1554);
        psVar1 = local_1548;
        sVar7 = extraout_RDX_02;
      } while (local_1554 != 0);
      auVar13._0_4_ = -(uint)((int)psVar6->d[0] == 0 && (int)local_458[lVar10].d[2] == 0);
      auVar13._4_4_ =
           -(uint)(*(int *)((long)local_458[lVar10].d + 4) == 0 &&
                  *(int *)((long)local_458[lVar10].d + 0x14) == 0);
      auVar13._8_4_ = -(uint)((int)local_458[lVar10].d[1] == 0 && (int)local_458[lVar10].d[3] == 0);
      auVar13._12_4_ =
           -(uint)(*(int *)((long)local_458[lVar10].d + 0xc) == 0 &&
                  *(int *)((long)local_458[lVar10].d + 0x1c) == 0);
      iVar3 = movmskps(extraout_EAX_00,auVar13);
    } while (iVar3 == 0xf);
    iVar3 = secp256k1_ec_pubkey_create(local_1548,&local_1190,(uchar *)&local_13c8);
    if (iVar3 != 0) {
      local_1550 = 0x21;
      iVar3 = secp256k1_ec_pubkey_serialize
                        (psVar1,(uchar *)&local_13c8,&local_1550,&local_1190,0x102);
      if ((iVar3 != 0) && (local_1550 == 0x21)) {
        lVar4 = local_1528 * nCols;
        secp256k1_sha256_write(&local_12c8,pk + (index + lVar4) * 0x21,0x21);
        secp256k1_sha256_write(&local_12c8,(uchar *)&local_13c8,0x21);
        secp256k1_sha256_finalize(&local_12c8,(uchar *)&local_13c8);
        secp256k1_scalar_set_b32(&local_14e8,(uchar *)&local_13c8,&local_1554);
        if ((local_1554 == 0) &&
           ((local_14e8.d[3] != 0 || local_14e8.d[1] != 0) ||
            (local_14e8.d[2] != 0 || local_14e8.d[0] != 0))) {
          uVar5 = (index + 1) % nCols;
          if (uVar5 == 0) {
            *(undefined8 *)(local_1500 + 0x10) = local_13b8;
            *(undefined8 *)(local_1500 + 0x18) = uStack_13b0;
            *(undefined8 *)local_1500 = local_13c8;
            *(undefined8 *)(local_1500 + 8) = uStack_13c0;
          }
          if (uVar5 != index) {
            local_1450 = lVar4;
            do {
              puVar9 = local_1150;
              psVar8 = &local_12c8;
              for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
                *(undefined8 *)psVar8->s = *puVar9;
                puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
                psVar8 = (secp256k1_sha256 *)((long)psVar8 + ((ulong)bVar11 * -2 + 1) * 8);
              }
              lVar4 = 0;
              local_1530 = uVar5;
              do {
                local_1540 = lVar4;
                do {
                  do {
                    secp256k1_rfc6979_hmac_sha256_generate(&local_11d4,(uchar *)&local_13c8,uVar5);
                    secp256k1_scalar_set_b32(&local_1470,(uchar *)&local_13c8,&local_1554);
                    uVar5 = extraout_RDX_03;
                  } while (local_1554 != 0);
                } while ((local_1470.d[3] == 0 && local_1470.d[1] == 0) &&
                         (local_1470.d[2] == 0 && local_1470.d[0] == 0));
                lVar4 = local_1540 * nCols + local_1530;
                lVar10 = lVar4 * 0x20;
                *(undefined8 *)(local_1538 + lVar10 + 0x10) = local_13b8;
                *(undefined8 *)(local_1538 + lVar10 + 0x10 + 8) = uStack_13b0;
                *(undefined8 *)(local_1538 + lVar10) = local_13c8;
                *(undefined8 *)(local_1538 + lVar10 + 8) = uStack_13c0;
                pub = pk + lVar4 * 0x21;
                iVar3 = secp256k1_eckey_pubkey_parse(&local_14c8,pub,0x21);
                if (iVar3 == 0) {
                  return 1;
                }
                local_1448.infinity = local_14c8.infinity;
                local_1448.x.n[4] = local_14c8.x.n[4];
                local_1448.x.n[2] = local_14c8.x.n[2];
                local_1448.x.n[3] = local_14c8.x.n[3];
                local_1448.x.n[0] = local_14c8.x.n[0];
                local_1448.x.n[1] = local_14c8.x.n[1];
                local_1448.y.n[4] = local_14c8.y.n[4];
                local_1448.y.n[2] = local_14c8.y.n[2];
                local_1448.y.n[3] = local_14c8.y.n[3];
                local_1448.y.n[0] = local_14c8.y.n[0];
                local_1448.y.n[1] = local_14c8.y.n[1];
                local_1448.z.n[0] = 1;
                local_1448.z.n[3] = 0;
                local_1448.z.n[4] = 0;
                local_1448.z.n[1] = 0;
                local_1448.z.n[2] = 0;
                local_1520.zr = local_10e8;
                local_1520.pre_a = local_f28;
                local_1520.ps = &local_868;
                local_1520.prej = local_c68;
                secp256k1_ecmult_strauss_wnaf
                          (&local_1548->ecmult_ctx,&local_1520,&local_1348,1,&local_1448,&local_14e8
                           ,&local_1470);
                iVar3 = hash_to_curve(&local_14c8,pub,len_00);
                psVar1 = local_1548;
                if (iVar3 != 0) {
                  return 1;
                }
                local_1448.infinity = local_14c8.infinity;
                local_1448.x.n[4] = local_14c8.x.n[4];
                local_1448.x.n[2] = local_14c8.x.n[2];
                local_1448.x.n[3] = local_14c8.x.n[3];
                local_1448.x.n[0] = local_14c8.x.n[0];
                local_1448.x.n[1] = local_14c8.x.n[1];
                local_1448.y.n[4] = local_14c8.y.n[4];
                local_1448.y.n[2] = local_14c8.y.n[2];
                local_1448.y.n[3] = local_14c8.y.n[3];
                local_1448.y.n[0] = local_14c8.y.n[0];
                local_1448.y.n[1] = local_14c8.y.n[1];
                local_1448.z.n[0] = 1;
                local_1448.z.n[3] = 0;
                local_1448.z.n[4] = 0;
                local_1448.z.n[1] = 0;
                local_1448.z.n[2] = 0;
                local_1520.prej = local_c68;
                local_1520.zr = local_10e8;
                local_1520.pre_a = local_f28;
                local_1520.ps = &local_868;
                secp256k1_ecmult_strauss_wnaf
                          (&local_1548->ecmult_ctx,&local_1520,&local_1448,1,&local_1448,&local_1470
                           ,&local_1388);
                lVar4 = local_1540;
                iVar3 = secp256k1_eckey_pubkey_parse
                                  (&local_14c8,local_14f0 + local_1540 * 0x21,0x21);
                if (iVar3 == 0) {
                  return 1;
                }
                local_11e0 = local_14c8.infinity;
                local_1258._32_8_ = local_14c8.x.n[4];
                local_1258._16_8_ = local_14c8.x.n[2];
                local_1258._24_8_ = local_14c8.x.n[3];
                local_1258._0_8_ = local_14c8.x.n[0];
                local_1258._8_8_ = local_14c8.x.n[1];
                local_1258._72_8_ = local_14c8.y.n[4];
                local_1258._56_8_ = local_14c8.y.n[2];
                local_1258._64_8_ = local_14c8.y.n[3];
                local_1258._40_8_ = local_14c8.y.n[0];
                local_1258._48_8_ = local_14c8.y.n[1];
                local_1258._80_8_ = 1;
                local_11f0 = (undefined1  [16])0x0;
                local_1258._88_16_ = (undefined1  [16])0x0;
                local_1520.prej = local_c68;
                local_1520.zr = local_10e8;
                local_1520.pre_a = local_f28;
                local_1520.ps = &local_868;
                rzr = (secp256k1_fe *)0x1;
                secp256k1_ecmult_strauss_wnaf
                          (&psVar1->ecmult_ctx,&local_1520,(secp256k1_gej *)local_1258,1,
                           (secp256k1_gej *)local_1258,&local_14e8,&local_1388);
                secp256k1_gej_add_var(&local_fa8,&local_1448,(secp256k1_gej *)local_1258,rzr);
                secp256k1_sha256_write(&local_12c8,pub,0x21);
                secp256k1_ge_set_gej(&local_14c8,&local_1348);
                secp256k1_eckey_pubkey_serialize(&local_14c8,(uchar *)&local_13c8,&local_1550,1);
                secp256k1_sha256_write(&local_12c8,(uchar *)&local_13c8,0x21);
                secp256k1_ge_set_gej(&local_14c8,&local_fa8);
                secp256k1_eckey_pubkey_serialize(&local_14c8,(uchar *)&local_13c8,&local_1550,1);
                secp256k1_sha256_write(&local_12c8,(uchar *)&local_13c8,0x21);
                lVar4 = lVar4 + 1;
                uVar5 = extraout_RDX_04;
              } while (lVar4 != local_1528);
              do {
                do {
                  secp256k1_rfc6979_hmac_sha256_generate(&local_11d4,(uchar *)&local_13c8,uVar5);
                  secp256k1_scalar_set_b32(&local_1470,(uchar *)&local_13c8,&local_1554);
                  uVar5 = extraout_RDX_05;
                } while (local_1554 != 0);
              } while ((local_1470.d[3] == 0 && local_1470.d[1] == 0) &&
                       (local_1470.d[2] == 0 && local_1470.d[0] == 0));
              lVar4 = local_1450 + local_1530;
              lVar10 = lVar4 * 0x20;
              *(undefined8 *)(local_1538 + lVar10 + 0x10) = local_13b8;
              *(undefined8 *)(local_1538 + lVar10 + 0x10 + 8) = uStack_13b0;
              *(undefined8 *)(local_1538 + lVar10) = local_13c8;
              *(undefined8 *)(local_1538 + lVar10 + 8) = uStack_13c0;
              iVar3 = secp256k1_eckey_pubkey_parse(&local_14c8,pk + lVar4 * 0x21,0x21);
              if (iVar3 == 0) {
                return 1;
              }
              local_1448.infinity = local_14c8.infinity;
              local_1448.x.n[4] = local_14c8.x.n[4];
              local_1448.x.n[2] = local_14c8.x.n[2];
              local_1448.x.n[3] = local_14c8.x.n[3];
              local_1448.x.n[0] = local_14c8.x.n[0];
              local_1448.x.n[1] = local_14c8.x.n[1];
              local_1448.y.n[4] = local_14c8.y.n[4];
              local_1448.y.n[2] = local_14c8.y.n[2];
              local_1448.y.n[3] = local_14c8.y.n[3];
              local_1448.y.n[0] = local_14c8.y.n[0];
              local_1448.y.n[1] = local_14c8.y.n[1];
              local_1448.z.n[0] = 1;
              local_1448.z.n[3] = 0;
              local_1448.z.n[4] = 0;
              local_1448.z.n[1] = 0;
              local_1448.z.n[2] = 0;
              secp256k1_ecmult(&local_1548->ecmult_ctx,&local_1348,&local_1448,&local_14e8,
                               &local_1470);
              secp256k1_sha256_write(&local_12c8,pk + lVar4 * 0x21,0x21);
              secp256k1_ge_set_gej(&local_14c8,&local_1348);
              secp256k1_eckey_pubkey_serialize(&local_14c8,(uchar *)&local_13c8,&local_1550,1);
              secp256k1_sha256_write(&local_12c8,(uchar *)&local_13c8,0x21);
              secp256k1_sha256_finalize(&local_12c8,(uchar *)&local_13c8);
              secp256k1_scalar_set_b32(&local_14e8,(uchar *)&local_13c8,&local_1554);
              if (local_1554 != 0) {
                return 1;
              }
              if ((local_14e8.d[3] == 0 && local_14e8.d[1] == 0) &&
                  (local_14e8.d[2] == 0 && local_14e8.d[0] == 0)) {
                return 1;
              }
              uVar5 = 0;
              if (local_1530 + 1 != nCols) {
                uVar5 = local_1530 + 1;
              }
              if (uVar5 == 0) {
                *(undefined8 *)(local_1500 + 0x10) = local_13b8;
                *(undefined8 *)(local_1500 + 0x18) = uStack_13b0;
                *(undefined8 *)local_1500 = local_13c8;
                *(undefined8 *)(local_1500 + 8) = uStack_13c0;
              }
            } while (uVar5 != index);
          }
          local_1538 = local_1538 + index * 0x20;
          local_14f8 = local_14f8 << 5;
          psVar6 = local_458;
          sVar7 = 0;
          while ((secp256k1_scalar_set_b32(&local_1470,sk[sVar7],&local_1554), local_1554 == 0 &&
                 ((local_1470.d[3] != 0 || local_1470.d[1] != 0) ||
                  (local_1470.d[2] != 0 || local_1470.d[0] != 0)))) {
            secp256k1_scalar_mul(&local_1368,&local_14e8,&local_1470);
            secp256k1_scalar_negate(&local_1368,&local_1368);
            secp256k1_scalar_add(&local_1470,psVar6,&local_1368);
            puVar2 = local_1538;
            secp256k1_scalar_get_b32(local_1538,&local_1470);
            sVar7 = sVar7 + 1;
            local_1538 = puVar2 + local_14f8;
            psVar6 = psVar6 + 1;
            if (nRows == sVar7) {
              return 0;
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int secp256k1_generate_mlsag(const secp256k1_context *ctx,
    uint8_t *ki, uint8_t *pc, uint8_t *ps,
    const uint8_t *nonce, const uint8_t *preimage, size_t nCols,
    size_t nRows, size_t index, const uint8_t **sk, const uint8_t *pk)
{
    /* nRows == nInputs + 1, last row sums commitments
    */

    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_sha256 sha256_m, sha256_pre;
    size_t dsRows = nRows-1; /* TODO: pass in dsRows explicitly? */
    /* secp256k1_scalar alpha[nRows]; */
    secp256k1_scalar alpha[MLSAG_MAX_ROWS]; /* To remove MLSAG_MAX_ROWS limit, malloc 32 * nRows for alpha  */
    secp256k1_scalar zero, clast, s, ss;
    secp256k1_pubkey pubkey;
    secp256k1_ge ge1;
    secp256k1_gej gej1, gej2, L, R;
    uint8_t tmp[32 + 32];
    size_t i, k, clen;
    int overflow;

    if (!pk
        || nRows < 2
        || nCols < 1
        || nRows > MLSAG_MAX_ROWS) {
        return 1;
    }

    secp256k1_scalar_set_int(&zero, 0);

    memcpy(tmp, nonce, 32);
    memcpy(tmp+32, preimage, 32);

    /* seed the random no. generator */
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, tmp, 32 + 32);

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, preimage, 32);
    sha256_pre = sha256_m;

    for (k = 0; k < dsRows; ++k) {
        do {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            secp256k1_scalar_set_b32(&alpha[k], tmp, &overflow);
        } while (overflow || secp256k1_scalar_is_zero(&alpha[k]));

        if (!secp256k1_ec_pubkey_create(ctx, &pubkey, tmp)) { /* G * alpha[col] */
            return 1;
        }
        clen = 33; /* must be set */
        if (!secp256k1_ec_pubkey_serialize(ctx, tmp, &clen, &pubkey, SECP256K1_EC_COMPRESSED)
            || clen != 33) {
            return 1;
        }

        secp256k1_sha256_write(&sha256_m, &pk[(index + k*nCols)*33], 33); /* pk_ind[col] */
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* G * alpha[col] */

        if (0 != hash_to_curve(&ge1, &pk[(index + k*nCols)*33], 33)) { /* H(pk_ind[col]) */
            return 1;
        }

        secp256k1_gej_set_ge(&gej1, &ge1);
        secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &alpha[k], &zero);  /* gej2 = H(pk_ind[col]) * alpha[col] */

        secp256k1_ge_set_gej(&ge1, &gej2);
        secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* H(pk_ind[col]) * alpha[col] */

        secp256k1_scalar_set_b32(&s, sk[k], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&s)) {
            return 1;
        }
        secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &s, &zero);  /* gej2 = H(pk_ind[col]) * sk_ind[col] */
        secp256k1_ge_set_gej(&ge1, &gej2);
        secp256k1_eckey_pubkey_serialize(&ge1, &ki[k * 33], &clen, 1);
    }

    for (k = dsRows; k < nRows; ++k) {
        do {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            secp256k1_scalar_set_b32(&alpha[k], tmp, &overflow);
        } while (overflow || secp256k1_scalar_is_zero(&alpha[k]));

        if (!secp256k1_ec_pubkey_create(ctx, &pubkey, tmp)) { /* G * alpha[col] */
            return 1;
        }
        clen = 33; /* must be set */
        if (!secp256k1_ec_pubkey_serialize(ctx, tmp, &clen, &pubkey, SECP256K1_EC_COMPRESSED)
            || clen != 33) {
            return 1;
        }
        secp256k1_sha256_write(&sha256_m, &pk[(index + k*nCols)*33], 33); /* pk_ind[col] */
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* G * alpha[col] */
    }

    secp256k1_sha256_finalize(&sha256_m, tmp);
    secp256k1_scalar_set_b32(&clast, tmp, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&clast)) {
        return 1;
    }

    i = (index + 1) % nCols;

    if (i == 0) {
        memcpy(pc, tmp, 32); /* *pc = clast */
    }

    while (i != index) {
        sha256_m = sha256_pre; /* set to after preimage hashed */

        for (k = 0; k < dsRows; ++k) {
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&ss, tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&ss));

            memcpy(&ps[(i + k*nCols)*32], tmp, 32);

            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss); /* L = G * ss + pk[k][i] * clast */


            /* R = H(pk[k][i]) * ss + ki[k] * clast */
            if (0 != hash_to_curve(&ge1, &pk[(i + k*nCols)*33], 33)) { /* H(pk[k][i]) */
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej1, &gej1, &ss, &zero); /* gej1 = H(pk[k][i]) * ss */

            if (!secp256k1_eckey_pubkey_parse(&ge1, &ki[k * 33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej2, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej2, &clast, &zero); /* gej2 = ki[k] * clast */

            secp256k1_gej_add_var(&R, &gej1, &gej2, NULL);  /* R =  gej1 + gej2 */

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
            secp256k1_ge_set_gej(&ge1, &R);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* R */
        }

        for (k = dsRows; k < nRows; ++k) {
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&ss, tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&ss));

            memcpy(&ps[(i + k*nCols)*32], tmp, 32);

            /* L = G * ss + pk[k][i] * clast */
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
        }

        secp256k1_sha256_finalize(&sha256_m, tmp);
        secp256k1_scalar_set_b32(&clast, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&clast)) {
            return 1;
        }
        i = (i + 1) % nCols;

        if (i == 0) {
            memcpy(pc, tmp, 32); /* *pc = clast */
        }
    }


    for (k = 0; k < nRows; ++k) {
        /* ss[k][index] = alpha[k] - clast * sk[k] */

        secp256k1_scalar_set_b32(&ss, sk[k], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ss)) {
            return 1;
        }
        secp256k1_scalar_mul(&s, &clast, &ss);

        secp256k1_scalar_negate(&s, &s);
        secp256k1_scalar_add(&ss, &alpha[k], &s);

        secp256k1_scalar_get_b32(&ps[(index + k*nCols)*32], &ss);
    }

    secp256k1_rfc6979_hmac_sha256_finalize(&rng);

    return 0;
}